

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

void calcBias<Blob<1280>,Blob<128>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  code *in_RDI;
  byte in_R8B;
  int bitB;
  int bitA;
  int iOut;
  int iBit;
  int *cursor;
  int irep;
  Blob<128> B;
  Blob<128> A;
  Blob<1280> K;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  uint32_t local_108;
  uint32_t local_104;
  int *in_stack_ffffffffffffff00;
  int iVar3;
  undefined4 in_stack_ffffffffffffff0c;
  Rand *in_stack_ffffffffffffff10;
  Blob<128> local_e4;
  Blob<1280> local_d4;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  byte local_21;
  int local_14;
  vector<int,_std::allocator<int>_> *local_10;
  code *local_8;
  
  local_21 = in_R8B & 1;
  local_28 = 0xa0;
  local_2c = 0x10;
  local_30 = 0x500;
  local_34 = 0x80;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Blob<1280>::Blob(&local_d4);
  Blob<128>::Blob(&local_e4);
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffff0c);
  for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
    if (((local_21 & 1) != 0) && (iVar3 % (local_14 / 10) == 0)) {
      printf(".");
    }
    Rand::rand_p(in_stack_ffffffffffffff10,(void *)CONCAT44(in_stack_ffffffffffffff0c,iVar3),
                 (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    (*local_8)(&local_d4,0xa0,0,&local_e4);
    in_stack_ffffffffffffff00 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    for (local_104 = 0; (int)local_104 < 0x500; local_104 = local_104 + 1) {
      flipbit(&local_d4,0xa0,local_104);
      (*local_8)(&local_d4,0xa0,0,&stack0xffffffffffffff0c);
      flipbit(&local_d4,0xa0,local_104);
      for (local_108 = 0; (int)local_108 < 0x80; local_108 = local_108 + 1) {
        uVar1 = getbit(&local_e4,0x10,local_108);
        uVar2 = getbit(&stack0xffffffffffffff0c,0x10,local_108);
        *in_stack_ffffffffffffff00 = (uVar1 ^ uVar2) + *in_stack_ffffffffffffff00;
        in_stack_ffffffffffffff00 = in_stack_ffffffffffffff00 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}